

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# system.c
# Opt level: O1

EcsTrigger * trigger_find_or_create(ecs_vector_t **triggers,ecs_entity_t entity)

{
  EcsTrigger *pEVar1;
  EcsTrigger *pEVar2;
  ulong uVar3;
  uint uVar4;
  EcsTrigger *pEVar5;
  EcsTrigger *pEVar6;
  ulong uVar7;
  bool bVar8;
  
  uVar4 = ecs_vector_count(*triggers);
  pEVar5 = (EcsTrigger *)_ecs_vector_first(*triggers,0x28,0x10);
  bVar8 = 0 < (int)uVar4;
  pEVar6 = pEVar5;
  if ((0 < (int)uVar4) && (pEVar5->self != entity)) {
    uVar3 = 1;
    pEVar1 = pEVar5;
    do {
      uVar7 = uVar3;
      pEVar6 = pEVar5;
      if (uVar4 == uVar7) break;
      pEVar2 = pEVar1 + 1;
      pEVar6 = pEVar1 + 1;
      uVar3 = uVar7 + 1;
      pEVar1 = pEVar1 + 1;
    } while (pEVar2->self != entity);
    bVar8 = uVar7 < uVar4;
  }
  if (bVar8) {
    return pEVar6;
  }
  pEVar6 = (EcsTrigger *)_ecs_vector_add(triggers,0x28,0x10);
  return pEVar6;
}

Assistant:

static
EcsTrigger* trigger_find_or_create(
    ecs_vector_t **triggers,
    ecs_entity_t entity)
{
    ecs_vector_each(*triggers, EcsTrigger, trigger, {
        if (trigger->self == entity) {
            return trigger;
        }
    });

    EcsTrigger *result = ecs_vector_add(triggers, EcsTrigger);
    return result;
}